

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test<trng::twosided_exponential_dist<double>>
               (twosided_exponential_dist<double> *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  SourceLineInfo local_148;
  string local_138;
  SectionInfo local_118;
  Section local_c8;
  
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_148.line = 0xd3;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"integrate pdf","");
  Catch::SectionInfo::SectionInfo(&local_118,&local_148,&local_138);
  Catch::Section::Section(&local_c8,&local_118);
  paVar2 = &local_118.description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  paVar3 = &local_118.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  bVar4 = Catch::Section::operator_cast_to_bool(&local_c8);
  if (bVar4) {
    continuous_dist_test_integrate_pdf<trng::twosided_exponential_dist<double>>(d);
  }
  Catch::Section::~Section(&local_c8);
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_148.line = 0xd6;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"icdf","");
  Catch::SectionInfo::SectionInfo(&local_118,&local_148,&local_138);
  Catch::Section::Section(&local_c8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  bVar4 = Catch::Section::operator_cast_to_bool(&local_c8);
  if (bVar4) {
    continuous_dist_test_icdf<trng::twosided_exponential_dist<double>>(d);
  }
  Catch::Section::~Section(&local_c8);
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_148.line = 0xd9;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"chi2 test","");
  Catch::SectionInfo::SectionInfo(&local_118,&local_148,&local_138);
  Catch::Section::Section(&local_c8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  bVar4 = Catch::Section::operator_cast_to_bool(&local_c8);
  if (bVar4) {
    continuous_dist_test_chi2_test<trng::twosided_exponential_dist<double>>(d);
  }
  Catch::Section::~Section(&local_c8);
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_148.line = 0xdc;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"streamable","");
  Catch::SectionInfo::SectionInfo(&local_118,&local_148,&local_138);
  Catch::Section::Section(&local_c8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  bVar4 = Catch::Section::operator_cast_to_bool(&local_c8);
  if (bVar4) {
    continuous_dist_test_streamable<trng::twosided_exponential_dist<double>>(d);
  }
  Catch::Section::~Section(&local_c8);
  return;
}

Assistant:

void continuous_dist_test(T &d) {
  SECTION("integrate pdf") {
    continuous_dist_test_integrate_pdf(d);
  }
  SECTION("icdf") {
    continuous_dist_test_icdf(d);
  }
  SECTION("chi2 test") {
    continuous_dist_test_chi2_test(d);
  }
  SECTION("streamable") {
    continuous_dist_test_streamable(d);
  }
}